

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O2

void __thiscall module::SequentialModule::~SequentialModule(SequentialModule *this)

{
  pointer ppLVar1;
  Layer *pLVar2;
  int i;
  ulong uVar3;
  
  this->_vptr_SequentialModule = (_func_int **)&PTR__SequentialModule_00107d38;
  if (this->_in != (tensor)0x0) {
    type::destroyTensor(this->_in);
  }
  uVar3 = 0;
  while( true ) {
    ppLVar1 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_lLayers).
                      super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar3) break;
    pLVar2 = ppLVar1[uVar3];
    if (pLVar2 != (Layer *)0x0) {
      (*pLVar2->_vptr_Layer[1])();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>::~_Vector_base
            (&(this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>);
  return;
}

Assistant:

SequentialModule::~SequentialModule()
    {
        if(_in != nullptr) type::destroyTensor(_in);

        for(int i(0); i < _lLayers.size(); i++)
            delete _lLayers[i];
    }